

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab6-1.c
# Opt level: O2

int feederBig(void)

{
  int iVar1;
  FILE *__s;
  size_t sVar2;
  uint uVar3;
  
  __s = fopen("in.txt","w+");
  if (__s == (FILE *)0x0) {
    puts("can\'t create in.txt. No space on disk?");
  }
  else {
    fwrite("2000000\n",8,1,__s);
    uVar3 = 0;
    do {
      if (uVar3 == 2000000) {
        fputc(10,__s);
        fclose(__s);
        sVar2 = GetLabPointerSize();
        LabMemoryLimit = sVar2 * 4000000 + 0x1342400;
        return 0;
      }
      iVar1 = fprintf(__s,"%d ",(ulong)uVar3);
      uVar3 = uVar3 + 1;
    } while (-1 < iVar1);
    puts("can\'t create in.txt. No space on disk?");
    fclose(__s);
  }
  return -1;
}

Assistant:

static int feederBig(void)
{
    FILE *const in = fopen("in.txt", "w+");
    int i;
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    fprintf(in, "2000000\n");
    for (i = 0; i < 2000000; i++) {
        if (fprintf(in, "%d ", i) < 0) {
            printf("can't create in.txt. No space on disk?\n");
            fclose(in);
            return -1;
        }
    }
    fprintf(in, "\n");
    fclose(in);
    LabMemoryLimit = 2000000*(sizeof(int)+sizeof(int)+2*GetLabPointerSize())+MIN_PROCESS_RSS_BYTES;
    return 0;
}